

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QSslConfiguration __thiscall QSslSocket::sslConfiguration(QSslSocket *this)

{
  long lVar1;
  SslProtocol SVar2;
  QSslSocketPrivate *pQVar3;
  QSharedDataPointer<QSslConfigurationPrivate> in_RDI;
  long in_FS_OFFSET;
  QSslConfigurationPrivate *copy;
  QSslSocketPrivate *d;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QSslSocketPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSslSocket *)0x3a1d67);
  pQVar3 = (QSslSocketPrivate *)operator_new(0x140);
  QSslConfigurationPrivate::QSslConfigurationPrivate
            ((QSslConfigurationPrivate *)in_RDI.d.ptr,
             (QSslConfigurationPrivate *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  this_00 = pQVar3;
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)in_RDI.d.ptr,in_stack_ffffffffffffffac);
  QSslSocketPrivate::sessionCipher(this_00);
  QSslCipher::operator=
            ((QSslCipher *)in_RDI.d.ptr,
             (QSslCipher *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QSslCipher::~QSslCipher((QSslCipher *)0x3a1dd6);
  SVar2 = QSslSocketPrivate::sessionProtocol
                    ((QSslSocketPrivate *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  *(SslProtocol *)&(pQVar3->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x50 = SVar2
  ;
  QSslConfiguration::QSslConfiguration
            ((QSslConfiguration *)in_RDI.d.ptr,
             (QSslConfigurationPrivate *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSslConfiguration QSslSocket::sslConfiguration() const
{
    Q_D(const QSslSocket);

    // create a deep copy of our configuration
    QSslConfigurationPrivate *copy = new QSslConfigurationPrivate(d->configuration);
    copy->ref.storeRelaxed(0);              // the QSslConfiguration constructor refs up
    copy->sessionCipher = d->sessionCipher();
    copy->sessionProtocol = d->sessionProtocol();

    return QSslConfiguration(copy);
}